

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseExpr(WastParser *this,ExprList *exprs)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pIVar6;
  pointer pTVar7;
  pointer pTVar8;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_fffffffffffff848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6f0;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_6d8;
  Location local_6d0;
  Enum local_6b0;
  Enum local_6ac;
  Enum local_6a8;
  Enum local_6a4;
  undefined1 local_6a0 [8];
  __single_object expr_5;
  Token local_658;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_618;
  Location local_610;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5ea;
  allocator<char> local_5e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  iterator local_5c8;
  size_type local_5c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b8;
  Enum local_59c;
  Enum local_598;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_594;
  allocator<char> local_593;
  allocator<char> local_592;
  allocator<char> local_591;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  string asStack_570 [32];
  string asStack_550 [32];
  iterator local_530;
  size_type local_528;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_520;
  Enum local_508;
  Enum local_504;
  undefined1 local_500 [8];
  Var var;
  undefined1 local_470 [4];
  TokenType type;
  Enum local_430;
  Enum local_42c;
  Enum local_428;
  Enum local_424;
  Enum local_420;
  Enum local_41c;
  undefined1 local_418 [8];
  __single_object expr_4;
  Token local_3d0;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_390;
  Location local_388;
  Enum local_364;
  Enum local_360;
  Enum local_35c;
  Location local_358;
  Enum local_338;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_332;
  allocator<char> local_331;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  iterator local_310;
  size_type local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300;
  Enum local_2e4;
  iterator local_2e0;
  Enum local_2cc;
  undefined1 local_2c8 [8];
  ExprList cond;
  undefined1 local_2a8 [8];
  __single_object expr_3;
  Token local_260;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_220;
  Enum local_218;
  Enum local_214;
  undefined1 local_210 [8];
  __single_object expr_2;
  Token local_1c8;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_188;
  Enum local_180;
  Enum local_17c;
  undefined1 local_178 [8];
  __single_object expr_1;
  Token local_130;
  undefined1 local_f0 [8];
  Location loc;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c2;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  iterator local_a0;
  size_type local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  Enum local_78;
  Enum local_74;
  uint local_70;
  Enum local_6c;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_68;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> expr;
  ExprList *exprs_local;
  WastParser *this_local;
  
  bVar1 = PeekMatch(this,Lpar,0);
  if (!bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  TVar2 = Peek(this,1);
  bVar1 = anon_unknown_1::IsPlainInstr(TVar2);
  if (bVar1) {
    Consume((Token *)&expr,this);
    std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
    unique_ptr<std::default_delete<wabt::Expr>,void>
              ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_68);
    local_6c = (Enum)ParsePlainInstr(this,&local_68);
    bVar1 = Failed((Result)local_6c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_70 = 1;
    }
    else {
      local_74 = (Enum)ParseExprList(this,exprs);
      bVar1 = Failed((Result)local_74);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_70 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"an expr",&local_c1);
        local_a0 = &local_c0;
        local_98 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_c2);
        __l_02._M_len = local_98;
        __l_02._M_array = local_a0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_90,__l_02,&local_c2);
        local_78 = (Enum)ErrorIfLpar(this,&local_90,(char *)0x0);
        bVar1 = Failed((Result)local_78);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_90);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_c2);
        local_6f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0;
        do {
          local_6f0 = local_6f0 + -1;
          std::__cxx11::string::~string((string *)local_6f0);
        } while (local_6f0 != &local_c0);
        std::allocator<char>::~allocator(&local_c1);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_70 = 1;
        }
        else {
          std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::unique_ptr
                    ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                     ((long)&loc.field_1 + 8),&local_68);
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                           ((long)&loc.field_1 + 8));
          std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr
                    ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                     ((long)&loc.field_1 + 8));
          local_70 = 0;
        }
      }
    }
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_68);
    if (local_70 != 0) {
      return (Result)this_local._4_4_;
    }
    goto LAB_0019c39b;
  }
  GetLocation((Location *)local_f0,this);
  TVar2 = Peek(this,1);
  if (TVar2 == Block) {
    Consume(&local_130,this);
    Consume((Token *)&expr_1,this);
    std::make_unique<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Location&>((Location *)local_178);
    pBVar4 = std::
             unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
             ::operator->((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                           *)local_178);
    local_17c = (Enum)ParseLabelOpt(this,&(pBVar4->block).label);
    bVar1 = Failed((Result)local_17c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_70 = 1;
    }
    else {
      pBVar4 = std::
               unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
               ::operator->((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                             *)local_178);
      local_180 = (Enum)ParseBlock(this,&pBVar4->block);
      bVar1 = Failed((Result)local_180);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_70 = 1;
      }
      else {
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
        unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>>,void>
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_188,
                   (unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                    *)local_178);
        intrusive_list<wabt::Expr>::push_back(exprs,&local_188);
        std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_188);
        local_70 = 8;
      }
    }
    std::
    unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
    ::~unique_ptr((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                   *)local_178);
  }
  else if (TVar2 == If) {
    Consume(&local_260,this);
    Consume((Token *)&expr_3,this);
    std::make_unique<wabt::IfExpr,wabt::Location&>((Location *)local_2a8);
    pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                       ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)local_2a8);
    cond.size_._4_4_ = ParseLabelOpt(this,&(pIVar6->true_).label);
    bVar1 = Failed(cond.size_._4_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_70 = 1;
    }
    else {
      pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                         ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)local_2a8)
      ;
      cond.size_._0_4_ = ParseBlockDeclaration(this,&(pIVar6->true_).decl);
      bVar1 = Failed(cond.size_._0_4_);
      if (!bVar1) {
LAB_0019b4f0:
        bVar1 = PeekMatchExpr(this);
        if (bVar1) goto LAB_0019b505;
        local_2e4 = (Enum)Expect(this,Lpar);
        bVar1 = Failed((Result)local_2e4);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_70 = 1;
          goto LAB_0019b974;
        }
        bVar1 = Match(this,Then);
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_330,"then block",&local_331);
          local_310 = &local_330;
          local_308 = 1;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator(&local_332);
          __l_01._M_len = local_308;
          __l_01._M_array = local_310;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_300,__l_01,&local_332);
          this_local._4_4_ = ErrorExpected(this,&local_300,"(then ...)");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_300);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator(&local_332);
          local_738 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_310;
          do {
            local_738 = local_738 + -1;
            std::__cxx11::string::~string((string *)local_738);
          } while (local_738 != &local_330);
          std::allocator<char>::~allocator(&local_331);
          local_70 = 1;
          goto LAB_0019b974;
        }
        pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                           ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                            local_2a8);
        local_338 = (Enum)ParseTerminatingInstrList(this,&(pIVar6->true_).exprs);
        bVar1 = Failed((Result)local_338);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_70 = 1;
          goto LAB_0019b974;
        }
        GetLocation(&local_358,this);
        pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                           ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                            local_2a8);
        (pIVar6->true_).end_loc.filename._M_len = local_358.filename._M_len;
        (pIVar6->true_).end_loc.filename._M_str = local_358.filename._M_str;
        (pIVar6->true_).end_loc.field_1.field_1.offset = (size_t)local_358.field_1.field_1.offset;
        *(undefined8 *)((long)&(pIVar6->true_).end_loc.field_1 + 8) = local_358.field_1._8_8_;
        local_35c = (Enum)Expect(this,Rpar);
        bVar1 = Failed((Result)local_35c);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_70 = 1;
          goto LAB_0019b974;
        }
        bVar1 = MatchLpar(this,Else);
        if (bVar1) {
          pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                             ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                              local_2a8);
          local_360 = (Enum)ParseTerminatingInstrList(this,&pIVar6->false_);
          bVar1 = Failed((Result)local_360);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_70 = 1;
            goto LAB_0019b974;
          }
          local_364 = (Enum)Expect(this,Rpar);
          bVar1 = Failed((Result)local_364);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_70 = 1;
            goto LAB_0019b974;
          }
        }
        GetLocation(&local_388,this);
        pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                           ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                            local_2a8);
        (pIVar6->false_end_loc).filename._M_len = local_388.filename._M_len;
        (pIVar6->false_end_loc).filename._M_str = local_388.filename._M_str;
        (pIVar6->false_end_loc).field_1.field_1.offset = (size_t)local_388.field_1.field_1.offset;
        *(undefined8 *)((long)&(pIVar6->false_end_loc).field_1 + 8) = local_388.field_1._8_8_;
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
        unique_ptr<wabt::IfExpr,std::default_delete<wabt::IfExpr>,void>
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_390,
                   (unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)local_2a8);
        intrusive_list<wabt::Expr>::push_back(exprs,&local_390);
        std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_390);
        local_70 = 8;
        goto LAB_0019b974;
      }
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_70 = 1;
    }
LAB_0019b974:
    std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::~unique_ptr
              ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)local_2a8);
  }
  else if (TVar2 == Loop) {
    Consume(&local_1c8,this);
    Consume((Token *)&expr_2,this);
    std::make_unique<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Location&>((Location *)local_210)
    ;
    pBVar5 = std::
             unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
             ::operator->((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
                           *)local_210);
    local_214 = (Enum)ParseLabelOpt(this,&(pBVar5->block).label);
    bVar1 = Failed((Result)local_214);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_70 = 1;
    }
    else {
      pBVar5 = std::
               unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
               ::operator->((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
                             *)local_210);
      local_218 = (Enum)ParseBlock(this,&pBVar5->block);
      bVar1 = Failed((Result)local_218);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_70 = 1;
      }
      else {
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
        unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>>,void>
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_220,
                   (unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
                    *)local_210);
        intrusive_list<wabt::Expr>::push_back(exprs,&local_220);
        std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_220);
        local_70 = 8;
      }
    }
    std::
    unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
    ::~unique_ptr((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
                   *)local_210);
  }
  else if (TVar2 == Try) {
    Consume(&local_3d0,this);
    Consume((Token *)&expr_4,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&expr_4);
    std::make_unique<wabt::TryExpr,wabt::Location&>((Location *)local_418);
    pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                       ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)local_418)
    ;
    local_41c = (Enum)ParseLabelOpt(this,&(pTVar7->block).label);
    bVar1 = Failed((Result)local_41c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_70 = 1;
    }
    else {
      pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                         ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                          local_418);
      local_420 = (Enum)ParseBlockDeclaration(this,&(pTVar7->block).decl);
      bVar1 = Failed((Result)local_420);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_70 = 1;
      }
      else {
        local_424 = (Enum)Expect(this,Lpar);
        bVar1 = Failed((Result)local_424);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_70 = 1;
        }
        else {
          local_428 = (Enum)Expect(this,Do);
          bVar1 = Failed((Result)local_428);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_70 = 1;
          }
          else {
            pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                               ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                                local_418);
            local_42c = (Enum)ParseInstrList(this,&(pTVar7->block).exprs);
            bVar1 = Failed((Result)local_42c);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_70 = 1;
            }
            else {
              local_430 = (Enum)Expect(this,Rpar);
              bVar1 = Failed((Result)local_430);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                local_70 = 1;
              }
              else {
                bVar1 = PeekMatch(this,Lpar,0);
                if (bVar1) {
                  Consume((Token *)local_470,this);
                  TVar2 = Peek(this,0);
                  if (TVar2 == Delegate) {
                    Consume((Token *)((long)&var.field_2 + 0x18),this);
                    Var::Var((Var *)local_500);
                    local_504 = (Enum)ParseVar(this,(Var *)local_500);
                    bVar1 = Failed((Result)local_504);
                    if (bVar1) {
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      local_70 = 1;
                    }
                    else {
                      pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                               operator->((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>
                                           *)local_418);
                      Var::operator=(&pTVar7->delegate_target,(Var *)local_500);
                      pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                               operator->((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>
                                           *)local_418);
                      pTVar7->kind = Delegate;
                      local_508 = (Enum)Expect(this,Rpar);
                      bVar1 = Failed((Result)local_508);
                      if (bVar1) {
                        Result::Result((Result *)((long)&this_local + 4),Error);
                        local_70 = 1;
                      }
                      else {
                        local_70 = 0x2f;
                      }
                    }
                    Var::~Var((Var *)local_500);
                    if (local_70 != 0x2f) goto LAB_0019c0f8;
                  }
                  else if (TVar2 == Catch || TVar2 == CatchAll) {
                    pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                             operator->((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>
                                         *)local_418);
                    RVar3 = ParseCatchExprList(this,&pTVar7->catches);
                    bVar1 = Failed(RVar3);
                    if (bVar1) {
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      local_70 = 1;
                      goto LAB_0019c0f8;
                    }
                    pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                             operator->((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>
                                         *)local_418);
                    pTVar7->kind = Catch;
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_590,"catch",&local_591);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (asStack_570,"catch_all",&local_592);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (asStack_550,"delegate",&local_593);
                    local_530 = &local_590;
                    local_528 = 3;
                    std::
                    allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::allocator(&local_594);
                    __l_00._M_len = local_528;
                    __l_00._M_array = local_530;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_520,__l_00,&local_594);
                    local_598 = (Enum)ErrorExpected(this,&local_520,(char *)0x0);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_520);
                    std::
                    allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~allocator(&local_594);
                    local_760 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_530;
                    do {
                      local_760 = local_760 + -1;
                      std::__cxx11::string::~string((string *)local_760);
                    } while (local_760 != &local_590);
                    std::allocator<char>::~allocator(&local_593);
                    std::allocator<char>::~allocator(&local_592);
                    std::allocator<char>::~allocator(&local_591);
                  }
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5e8,"a valid try clause",&local_5e9);
                local_5c8 = &local_5e8;
                local_5c0 = 1;
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::allocator(&local_5ea);
                __l._M_len = local_5c0;
                __l._M_array = local_5c8;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_5b8,__l,&local_5ea);
                local_59c = (Enum)ErrorIfLpar(this,&local_5b8,(char *)0x0);
                bVar1 = Failed((Result)local_59c);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_5b8);
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~allocator(&local_5ea);
                local_788 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_5c8;
                do {
                  local_788 = local_788 + -1;
                  std::__cxx11::string::~string((string *)local_788);
                } while (local_788 != &local_5e8);
                std::allocator<char>::~allocator(&local_5e9);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  local_70 = 1;
                }
                else {
                  GetLocation(&local_610,this);
                  pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                           operator->((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>
                                       *)local_418);
                  (pTVar7->block).end_loc.filename._M_len = local_610.filename._M_len;
                  (pTVar7->block).end_loc.filename._M_str = local_610.filename._M_str;
                  (pTVar7->block).end_loc.field_1.field_1.offset =
                       (size_t)local_610.field_1.field_1.offset;
                  *(undefined8 *)((long)&(pTVar7->block).end_loc.field_1 + 8) =
                       local_610.field_1._8_8_;
                  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
                  unique_ptr<wabt::TryExpr,std::default_delete<wabt::TryExpr>,void>
                            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_618,
                             (unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                             local_418);
                  intrusive_list<wabt::Expr>::push_back(exprs,&local_618);
                  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr
                            (&local_618);
                  local_70 = 8;
                }
              }
            }
          }
        }
      }
    }
LAB_0019c0f8:
    std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::~unique_ptr
              ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)local_418);
  }
  else {
    if (TVar2 != TryTable) {
      __assert_fail("!\"ParseExpr should only be called when IsExpr() is true\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                    ,0xcef,"Result wabt::WastParser::ParseExpr(ExprList *)");
    }
    Consume(&local_658,this);
    Consume((Token *)&expr_5,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&expr_5);
    std::make_unique<wabt::TryTableExpr,wabt::Location&>((Location *)local_6a0);
    pTVar8 = std::unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>::
             operator->((unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_> *)
                        local_6a0);
    local_6a4 = (Enum)ParseLabelOpt(this,&(pTVar8->block).label);
    bVar1 = Failed((Result)local_6a4);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_70 = 1;
    }
    else {
      pTVar8 = std::unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>::
               operator->((unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                           *)local_6a0);
      local_6a8 = (Enum)ParseBlockDeclaration(this,&(pTVar8->block).decl);
      bVar1 = Failed((Result)local_6a8);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_70 = 1;
      }
      else {
        pTVar8 = std::unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>::
                 operator->((unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                             *)local_6a0);
        local_6ac = (Enum)ParseTryTableCatches(this,&pTVar8->catches);
        bVar1 = Failed((Result)local_6ac);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_70 = 1;
        }
        else {
          pTVar8 = std::unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>::
                   operator->((unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                               *)local_6a0);
          local_6b0 = (Enum)ParseInstrList(this,&(pTVar8->block).exprs);
          bVar1 = Failed((Result)local_6b0);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_70 = 1;
          }
          else {
            GetLocation(&local_6d0,this);
            pTVar8 = std::unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>::
                     operator->((unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>
                                 *)local_6a0);
            (pTVar8->block).end_loc.filename._M_len = local_6d0.filename._M_len;
            (pTVar8->block).end_loc.filename._M_str = local_6d0.filename._M_str;
            (pTVar8->block).end_loc.field_1.field_1.offset =
                 (size_t)local_6d0.field_1.field_1.offset;
            *(undefined8 *)((long)&(pTVar8->block).end_loc.field_1 + 8) = local_6d0.field_1._8_8_;
            std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
            unique_ptr<wabt::TryTableExpr,std::default_delete<wabt::TryTableExpr>,void>
                      ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_6d8,
                       (unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_> *)
                       local_6a0);
            intrusive_list<wabt::Expr>::push_back(exprs,&local_6d8);
            std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_6d8);
            local_70 = 8;
          }
        }
      }
    }
    std::unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_>::~unique_ptr
              ((unique_ptr<wabt::TryTableExpr,_std::default_delete<wabt::TryTableExpr>_> *)local_6a0
              );
  }
  if (local_70 == 1) {
    return (Result)this_local._4_4_;
  }
LAB_0019c39b:
  RVar3 = Expect(this,Rpar);
  bVar1 = Failed(RVar3);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
LAB_0019b505:
  intrusive_list<wabt::Expr>::intrusive_list((intrusive_list<wabt::Expr> *)local_2c8);
  local_2cc = (Enum)ParseExpr(this,(ExprList *)local_2c8);
  bVar1 = Failed((Result)local_2cc);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_2e0 = intrusive_list<wabt::Expr>::end(exprs);
    intrusive_list<wabt::Expr>::splice
              (exprs,(int)local_2e0.list_,(__off64_t *)local_2e0.node_,(int)local_2c8,in_R8,in_R9,
               in_stack_fffffffffffff848);
  }
  local_70 = (uint)bVar1;
  intrusive_list<wabt::Expr>::~intrusive_list((intrusive_list<wabt::Expr> *)local_2c8);
  if (local_70 != 0) goto LAB_0019b974;
  goto LAB_0019b4f0;
}

Assistant:

Result WastParser::ParseExpr(ExprList* exprs) {
  WABT_TRACE(ParseExpr);
  if (!PeekMatch(TokenType::Lpar)) {
    return Result::Error;
  }

  if (IsPlainInstr(Peek(1))) {
    Consume();
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    CHECK_RESULT(ParseExprList(exprs));
    CHECK_RESULT(ErrorIfLpar({"an expr"}));
    exprs->push_back(std::move(expr));
  } else {
    Location loc = GetLocation();

    switch (Peek(1)) {
      case TokenType::Block: {
        Consume();
        Consume();
        auto expr = std::make_unique<BlockExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Loop: {
        Consume();
        Consume();
        auto expr = std::make_unique<LoopExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::If: {
        Consume();
        Consume();
        auto expr = std::make_unique<IfExpr>(loc);

        CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));

        while (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        EXPECT(Lpar);
        if (!Match(TokenType::Then)) {
          return ErrorExpected({"then block"}, "(then ...)");
        }

        CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
        expr->true_.end_loc = GetLocation();
        EXPECT(Rpar);

        if (MatchLpar(TokenType::Else)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
          EXPECT(Rpar);
        }
        expr->false_end_loc = GetLocation();

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Try: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());

        auto expr = std::make_unique<TryExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        EXPECT(Lpar);
        EXPECT(Do);
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        EXPECT(Rpar);
        if (PeekMatch(TokenType::Lpar)) {
          Consume();
          TokenType type = Peek();
          switch (type) {
            case TokenType::Catch:
            case TokenType::CatchAll:
              CHECK_RESULT(ParseCatchExprList(&expr->catches));
              expr->kind = TryKind::Catch;
              break;
            case TokenType::Delegate: {
              Consume();
              Var var;
              CHECK_RESULT(ParseVar(&var));
              expr->delegate_target = var;
              expr->kind = TryKind::Delegate;
              EXPECT(Rpar);
              break;
            }
            default:
              ErrorExpected({"catch", "catch_all", "delegate"});
              break;
          }
        }
        CHECK_RESULT(ErrorIfLpar({"a valid try clause"}));
        expr->block.end_loc = GetLocation();
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::TryTable: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());
        auto expr = std::make_unique<TryTableExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        CHECK_RESULT(ParseTryTableCatches(&expr->catches));
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        expr->block.end_loc = GetLocation();
        exprs->push_back(std::move(expr));
        break;
      }

      default:
        assert(!"ParseExpr should only be called when IsExpr() is true");
        return Result::Error;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}